

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O3

void av1_init_lr_mt_buffers(AV1_COMP *cpi)

{
  LRWorkerData *pLVar1;
  AV1_PRIMARY *pAVar2;
  RestorationLineBuffers *pRVar3;
  PrimaryMultiThreadInfo *pPVar4;
  
  if (((cpi->mt_info).lr_row_sync.sync_range != 0) &&
     (pAVar2 = cpi->ppi, (pAVar2->gf_group).frame_parallel_level[cpi->gf_frame_index] < 1)) {
    pPVar4 = (PrimaryMultiThreadInfo *)((pAVar2->p_mt_info).num_mod_workers + 8);
    if (1 < (pAVar2->p_mt_info).num_mod_workers[10]) {
      pPVar4 = &pAVar2->p_mt_info;
    }
    pRVar3 = (cpi->common).rlbs;
    pLVar1 = (cpi->mt_info).lr_row_sync.lrworkerdata + (long)pPVar4->num_workers + -1;
    pLVar1->rst_tmpbuf = (cpi->common).rst_tmpbuf;
    pLVar1->rlbs = pRVar3;
    return;
  }
  return;
}

Assistant:

void av1_init_lr_mt_buffers(AV1_COMP *cpi) {
  AV1_COMMON *const cm = &cpi->common;
  AV1LrSync *lr_sync = &cpi->mt_info.lr_row_sync;
  if (lr_sync->sync_range) {
    if (cpi->ppi->gf_group.frame_parallel_level[cpi->gf_frame_index] > 0)
      return;
    int num_lr_workers =
        av1_get_num_mod_workers_for_alloc(&cpi->ppi->p_mt_info, MOD_LR);
    assert(num_lr_workers <= lr_sync->num_workers);
    lr_sync->lrworkerdata[num_lr_workers - 1].rst_tmpbuf = cm->rst_tmpbuf;
    lr_sync->lrworkerdata[num_lr_workers - 1].rlbs = cm->rlbs;
  }
}